

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O2

Var Js::RegexHelper::RegexEs6ReplaceImpl
              (ScriptContext *scriptContext,RecyclableObject *thisObj,JavascriptString *input,
              RecyclableObject *replaceFn)

{
  Recycler *this;
  RecyclableObject *instance;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  charcount_t cVar4;
  CharCount base;
  charcount_t offset;
  CharCount startIndex;
  Recycler *pRVar5;
  List<Js::RecyclableObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  Var pvVar6;
  JavascriptString *pJVar7;
  TempArenaAllocatorObject *tempAllocator;
  int64 iVar8;
  JavascriptString *instance_00;
  undefined4 *puVar9;
  ulong uVar10;
  long lVar11;
  WriteBarrierPtr<void> *this_01;
  ScriptContext *input_00;
  ulong uVar12;
  PCWSTR varName;
  ulong uVar13;
  CharCount in_stack_fffffffffffffce8;
  undefined1 local_310 [8];
  TrackAllocData data;
  ScriptContext *local_e8;
  ScriptContext *scriptContext_local;
  JavascriptString *input_local;
  RecyclableObject *replaceFn_local;
  TrackAllocData data_1;
  WriteBarrierPtr<void> *local_50;
  
  data_1._32_8_ = &local_e8;
  local_e8 = scriptContext;
  scriptContext_local = (ScriptContext *)input;
  input_local = (JavascriptString *)replaceFn;
  bVar2 = JavascriptRegExp::GetGlobalProperty(thisObj,scriptContext);
  if (bVar2) {
    JavascriptRegExp::GetUnicodeProperty(thisObj,scriptContext);
    JavascriptRegExp::SetLastIndexProperty(thisObj,&DAT_1000000000000,scriptContext);
  }
  this = scriptContext->recycler;
  local_310 = (undefined1  [8])
              &JsUtil::
               List<Js::RecyclableObject*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
               ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_895d3b0;
  data.filename._0_4_ = 0x3fd;
  pRVar5 = Memory::Recycler::TrackAllocInfo(this,(TrackAllocData *)local_310);
  this_00 = (List<Js::RecyclableObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)new<Memory::Recycler>(0x30,pRVar5,0x37a1d4);
  (this_00->super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).alloc =
       this;
  (this_00->super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_013d1470;
  (this_00->super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).buffer.
  ptr = (WriteBarrierPtr<Js::RecyclableObject> *)0x0;
  (this_00->super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).count = 0
  ;
  this_00->length = 0;
  this_00->increment = 4;
  while( true ) {
    pvVar6 = JavascriptRegExp::CallExec
                       (thisObj,input,L"RegExp.prototype[Symbol.replace]",scriptContext);
    BVar3 = JavascriptOperators::IsNull(pvVar6);
    if (BVar3 != 0) break;
    local_310 = (undefined1  [8])ExecResultToRecyclableObject(pvVar6);
    JsUtil::
    List<Js::RecyclableObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    Add(this_00,(RecyclableObject **)local_310);
    if (!bVar2) break;
    input_00 = scriptContext;
    pJVar7 = GetMatchStrFromResult((RecyclableObject *)local_310,scriptContext);
    AdvanceLastIndex(thisObj,(JavascriptString *)input_00,pJVar7,false,scriptContext);
  }
  CompoundString::Builder<256U>::Builder((Builder<256U> *)local_310,scriptContext);
  cVar4 = JavascriptString::GetLength(input);
  tempAllocator = ScriptContext::GetTemporaryAllocator(scriptContext,L"RegexHelper");
  startIndex = 0;
  local_50 = (WriteBarrierPtr<void> *)0x0;
  uVar13 = 0;
  for (lVar11 = 0;
      lVar11 < (this_00->
               super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).count;
      lVar11 = lVar11 + 1) {
    instance = (this_00->
               super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).buffer
               .ptr[lVar11].ptr;
    pvVar6 = JavascriptOperators::GetProperty(instance,0xd1,scriptContext,(PropertyValueInfo *)0x0);
    iVar8 = JavascriptConversion::ToLength(pvVar6,scriptContext);
    uVar12 = iVar8 - 1;
    if ((long)uVar12 < 1) {
      uVar12 = 0;
    }
    pJVar7 = GetMatchStrFromResult(instance,scriptContext);
    pvVar6 = JavascriptOperators::GetProperty(instance,0x1da,scriptContext,(PropertyValueInfo *)0x0)
    ;
    iVar8 = JavascriptConversion::ToLength(pvVar6,scriptContext);
    base = JavascriptRegExp::GetIndexOrMax(iVar8);
    if (cVar4 <= base) {
      base = cVar4;
    }
    uVar10 = 99;
    if ((long)uVar12 < 99) {
      uVar10 = uVar12;
    }
    if (local_50 == (WriteBarrierPtr<void> *)0x0) {
      replaceFn_local = (RecyclableObject *)&Memory::WriteBarrierPtr<void>::typeinfo;
      data_1.typeinfo = (type_info *)0x0;
      data_1.count = (size_t)anon_var_dwarf_895d3b0;
      data_1.filename._0_4_ = 0x432;
      data_1.plusSize = uVar10 + 1;
      pRVar5 = Memory::Recycler::TrackAllocInfo(this,(TrackAllocData *)&replaceFn_local);
      local_50 = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                           ((Memory *)pRVar5,(Recycler *)Memory::Recycler::Alloc,0,uVar10 + 1);
    }
    else if (uVar10 != uVar13) {
      local_50 = (WriteBarrierPtr<void> *)
                 Memory::Recycler::Realloc(this,local_50,uVar13 * 8 + 8,uVar10 * 8 + 8,true);
    }
    this_01 = local_50;
    for (uVar13 = 1; this_01 = this_01 + 1, uVar13 - uVar12 != 1; uVar13 = uVar13 + 1) {
      instance_00 = (JavascriptString *)JavascriptOperators::GetItem(instance,uVar13,scriptContext);
      BVar3 = JavascriptOperators::IsUndefined(instance_00);
      if (BVar3 == 0) {
        instance_00 = JavascriptConversion::ToString(instance_00,scriptContext);
      }
      if (uVar13 <= uVar10) {
        Memory::WriteBarrierPtr<void>::WriteBarrierSet(this_01,instance_00);
      }
    }
    if (startIndex <= base) {
      CompoundString::Builder<256U>::Append
                ((Builder<256U> *)local_310,input,startIndex,base - startIndex);
      RegexEs6ReplaceImpl::anon_class_24_3_9375e38d::operator()
                ((anon_class_24_3_9375e38d *)&data_1.line,(Builder<256U> *)local_310,
                 (ArenaAllocator *)pJVar7,(JavascriptString *)(uVar10 & 0xffffffff),(int)local_50,
                 (Type *)(ulong)base,in_stack_fffffffffffffce8);
      offset = JavascriptString::GetLength(pJVar7);
      startIndex = JavascriptRegExp::AddIndex(base,offset);
    }
    uVar13 = uVar10;
  }
  ScriptContext::ReleaseTemporaryAllocator(scriptContext,tempAllocator);
  if (startIndex <= cVar4 && cVar4 - startIndex != 0) {
    CompoundString::Builder<256U>::Append
              ((Builder<256U> *)local_310,input,startIndex,cVar4 - startIndex);
  }
  pJVar7 = CompoundString::Builder<256U>::ToString((Builder<256U> *)local_310);
  if (pJVar7 == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x45f,"(accumulatedResult != nullptr)",
                                "accumulatedResult != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar9 = 0;
  }
  return pJVar7;
}

Assistant:

Var RegexHelper::RegexEs6ReplaceImpl(ScriptContext* scriptContext, RecyclableObject* thisObj, JavascriptString* input, RecyclableObject* replaceFn)
    {
        auto appendReplacement = [&](
            CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)>& resultBuilder,
            ArenaAllocator* tempAlloc,
            JavascriptString* matchStr,
            int numberOfCaptures,
            Field(Var)* captures,
            CharCount position)
        {
            // replaceFn Arguments:
            //
            // 0: this
            // 1: matched
            // 2: capture1
            // ...
            // N + 1: capture N
            // N + 2: position
            // N + 3: input

            // Number of captures can be at most 99, so we won't overflow.
            ushort argCount = (ushort) numberOfCaptures + 4;

            PROBE_STACK_NO_DISPOSE(scriptContext, argCount * sizeof(Var));

            ThreadContext* threadContext = scriptContext->GetThreadContext();

            Var* args = (Var*) _alloca(argCount * sizeof(Var));

            args[0] = scriptContext->GetLibrary()->GetUndefined();
#pragma prefast(suppress:6386, "The write is within the bounds")
            args[1] = matchStr;
            for (int i = 1; i <= numberOfCaptures; ++i)
            {
                args[i + 1] = captures[i];
            }
            args[numberOfCaptures + 2] = JavascriptNumber::ToVar(position, scriptContext);
            args[numberOfCaptures + 3] = input;
            Js::Var replaceFnResult = threadContext->ExecuteImplicitCall(replaceFn, Js::ImplicitCall_Accessor, [=]()->Js::Var
            {
                return JavascriptFunction::CallFunction<true>(replaceFn, replaceFn->GetEntryPoint(), Arguments(CallInfo(argCount), args));
            });
            JavascriptString* replace = JavascriptConversion::ToString(replaceFnResult, scriptContext);

            resultBuilder.Append(replace);
        };
        return RegexEs6ReplaceImpl(scriptContext, thisObj, input, appendReplacement, /* noResult */ false);
    }